

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O2

plutovg_surface_t * plutovg_surface_create_uninitialized(int width,int height)

{
  plutovg_surface_t *ppVar1;
  
  if (0x1000000 < height || 0x1000000 < width) {
    return (plutovg_surface_t *)0x0;
  }
  ppVar1 = (plutovg_surface_t *)malloc((long)(width * 4 * height) + 0x18);
  if (ppVar1 == (plutovg_surface_t *)0x0) {
    ppVar1 = (plutovg_surface_t *)0x0;
  }
  else {
    ppVar1->ref_count = 1;
    ppVar1->width = width;
    ppVar1->height = height;
    ppVar1->stride = width * 4;
    ppVar1->data = (uchar *)(ppVar1 + 1);
  }
  return ppVar1;
}

Assistant:

static plutovg_surface_t* plutovg_surface_create_uninitialized(int width, int height)
{
    if(width > STBI_MAX_DIMENSIONS || height > STBI_MAX_DIMENSIONS)
        return NULL;
    const size_t size = width * height * 4;
    plutovg_surface_t* surface = malloc(size + sizeof(plutovg_surface_t));
    if(surface == NULL)
        return NULL;
    surface->ref_count = 1;
    surface->width = width;
    surface->height = height;
    surface->stride = width * 4;
    surface->data = (uint8_t*)(surface + 1);
    return surface;
}